

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstr_test.c
# Opt level: O1

void itoa_test(zt_unit_test *test,void *data)

{
  int iVar1;
  ssize_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  char buffer [100];
  short local_78;
  char cStack_76;
  int iStack_75;
  undefined1 uStack_71;
  short sStack_70;
  undefined1 uStack_6e;
  undefined5 uStack_6d;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_64 = 0;
  uStack_60 = 0;
  local_78 = 0;
  cStack_76 = '\0';
  iStack_75 = 0;
  uStack_71 = 0;
  sStack_70 = 0;
  uStack_6e = 0;
  uStack_6d = 0;
  local_18 = 0;
  sVar2 = zt_cstr_itoa((char *)0x0,0,0,100);
  if (sVar2 == -1) {
    zt_unit_test_add_assertion(test);
    sVar2 = zt_cstr_itoa((char *)&local_78,0,0,0);
    if (sVar2 == -1) {
      zt_unit_test_add_assertion(test);
      sVar2 = zt_cstr_itoa((char *)&local_78,10,5,6);
      if (sVar2 == -1) {
        zt_unit_test_add_assertion(test);
        sVar2 = zt_cstr_itoa((char *)&local_78,0,0,100);
        if (sVar2 == 1) {
          zt_unit_test_add_assertion(test);
          if (local_78 == 0x30) {
            zt_unit_test_add_assertion(test);
            sVar2 = zt_cstr_itoa((char *)&local_78,3,0,100);
            if (sVar2 == 1) {
              zt_unit_test_add_assertion(test);
              if (local_78 == 0x33) {
                zt_unit_test_add_assertion(test);
                sVar2 = zt_cstr_itoa((char *)&local_78,10,0,100);
                if (sVar2 == 2) {
                  zt_unit_test_add_assertion(test);
                  if (cStack_76 == '\0' && local_78 == 0x3031) {
                    zt_unit_test_add_assertion(test);
                    sVar2 = zt_cstr_itoa((char *)&local_78,0x2a,0,100);
                    if (sVar2 == 2) {
                      zt_unit_test_add_assertion(test);
                      if (cStack_76 == '\0' && local_78 == 0x3234) {
                        zt_unit_test_add_assertion(test);
                        sVar2 = zt_cstr_itoa((char *)&local_78,0x3ade68b1,0,100);
                        if (sVar2 == 9) {
                          zt_unit_test_add_assertion(test);
                          if (sStack_70 == 0x31 &&
                              CONCAT17(uStack_71,CONCAT43(iStack_75,CONCAT12(cStack_76,local_78)))
                              == 0x3233343536373839) {
                            zt_unit_test_add_assertion(test);
                            sVar2 = zt_cstr_itoa((char *)&local_78,-3,0,100);
                            if (sVar2 == 2) {
                              zt_unit_test_add_assertion(test);
                              if (cStack_76 == '\0' && local_78 == 0x332d) {
                                zt_unit_test_add_assertion(test);
                                sVar2 = zt_cstr_itoa((char *)&local_78,-10,0,100);
                                if (sVar2 == 3) {
                                  zt_unit_test_add_assertion(test);
                                  if (CONCAT13((undefined1)iStack_75,CONCAT12(cStack_76,local_78))
                                      == 0x30312d) {
                                    zt_unit_test_add_assertion(test);
                                    sVar2 = zt_cstr_itoa((char *)&local_78,-0x2a,0,100);
                                    if (sVar2 == 3) {
                                      zt_unit_test_add_assertion(test);
                                      if (CONCAT13((undefined1)iStack_75,
                                                   CONCAT12(cStack_76,local_78)) == 0x32342d) {
                                        zt_unit_test_add_assertion(test);
                                        sVar2 = zt_cstr_itoa((char *)&local_78,-0x3ade68b1,0,100);
                                        if (sVar2 == 10) {
                                          zt_unit_test_add_assertion(test);
                                          if (CONCAT17(uStack_6e,
                                                       CONCAT25(sStack_70,
                                                                CONCAT14(uStack_71,iStack_75))) ==
                                              0x31323334353637 &&
                                              CONCAT17(uStack_71,
                                                       CONCAT43(iStack_75,
                                                                CONCAT12(cStack_76,local_78))) ==
                                              0x333435363738392d) {
                                            zt_unit_test_add_assertion(test);
                                            local_78 = 0x6161;
                                            cStack_76 = 'a';
                                            iStack_75 = 0x61616161;
                                            uStack_71 = 0x61;
                                            sStack_70 = 0x6161;
                                            uStack_6e = 0x61;
                                            uStack_6d = 0x6161616161;
                                            local_68 = 0x61616161;
                                            sVar2 = zt_cstr_itoa((char *)&local_78,0x12d,3,100);
                                            if (sVar2 == 6) {
                                              zt_unit_test_add_assertion(test);
                                              if (iStack_75 == 0x313033 &&
                                                  CONCAT13((undefined1)iStack_75,
                                                           CONCAT12(cStack_76,local_78)) ==
                                                  0x33616161) {
                                                zt_unit_test_add_assertion(test);
                                                local_78 = 0x6161;
                                                cStack_76 = 'a';
                                                iStack_75 = 0x61616161;
                                                uStack_71 = 0x61;
                                                sStack_70 = 0x6161;
                                                uStack_6e = 0x61;
                                                uStack_6d = 0x6161616161;
                                                local_68 = 0x61616161;
                                                sVar2 = zt_cstr_itoa((char *)&local_78,-0x1720,4,100
                                                                    );
                                                if (sVar2 == 9) {
                                                  zt_unit_test_add_assertion(test);
                                                  if (sStack_70 == 0x30 &&
                                                      CONCAT17(uStack_71,
                                                               CONCAT43(iStack_75,
                                                                        CONCAT12(cStack_76,local_78)
                                                                       )) == 0x3239352d61616161) {
                                                    zt_unit_test_add_assertion(test);
                                                    return;
                                                  }
                                                  pcVar3 = "strcmp(\"aaaa-5920\", buffer) == 0";
                                                  uVar4 = 0x18b;
                                                }
                                                else {
                                                  pcVar3 = 
                                                  "zt_cstr_itoa(buffer, -5920, 4, 100) == 9";
                                                  uVar4 = 0x18a;
                                                }
                                              }
                                              else {
                                                pcVar3 = "strcmp(\"aaa301\", buffer) == 0";
                                                uVar4 = 0x184;
                                              }
                                            }
                                            else {
                                              pcVar3 = "zt_cstr_itoa(buffer, 301, 3, 100) == 6";
                                              uVar4 = 0x183;
                                            }
                                          }
                                          else {
                                            pcVar3 = "strcmp(\"-987654321\", buffer) == 0";
                                            uVar4 = 0x17c;
                                          }
                                        }
                                        else {
                                          pcVar3 = "zt_cstr_itoa(buffer, -987654321, 0, 100) == 10";
                                          uVar4 = 0x17b;
                                        }
                                      }
                                      else {
                                        pcVar3 = "strcmp(\"-42\", buffer) == 0";
                                        uVar4 = 0x179;
                                      }
                                    }
                                    else {
                                      pcVar3 = "zt_cstr_itoa(buffer, -42, 0, 100) == 3";
                                      uVar4 = 0x178;
                                    }
                                  }
                                  else {
                                    pcVar3 = "strcmp(\"-10\", buffer) == 0";
                                    uVar4 = 0x176;
                                  }
                                }
                                else {
                                  pcVar3 = "zt_cstr_itoa(buffer, -10, 0, 100) == 3";
                                  uVar4 = 0x175;
                                }
                              }
                              else {
                                pcVar3 = "strcmp(\"-3\", buffer) == 0";
                                uVar4 = 0x173;
                              }
                            }
                            else {
                              pcVar3 = "zt_cstr_itoa(buffer, -3, 0, 100) == 2";
                              uVar4 = 0x172;
                            }
                          }
                          else {
                            pcVar3 = "strcmp(\"987654321\", buffer) == 0";
                            uVar4 = 0x170;
                          }
                        }
                        else {
                          pcVar3 = "zt_cstr_itoa(buffer, 987654321, 0, 100) == 9";
                          uVar4 = 0x16f;
                        }
                      }
                      else {
                        pcVar3 = "strcmp(\"42\", buffer) == 0";
                        uVar4 = 0x16d;
                      }
                    }
                    else {
                      pcVar3 = "zt_cstr_itoa(buffer, 42, 0, 100) == 2";
                      uVar4 = 0x16c;
                    }
                  }
                  else {
                    pcVar3 = "strcmp(\"10\", buffer) == 0";
                    uVar4 = 0x16a;
                  }
                }
                else {
                  pcVar3 = "zt_cstr_itoa(buffer, 10, 0, 100) == 2";
                  uVar4 = 0x169;
                }
              }
              else {
                pcVar3 = "strcmp(\"3\", buffer) == 0";
                uVar4 = 0x167;
              }
            }
            else {
              pcVar3 = "zt_cstr_itoa(buffer, 3, 0, 100) == 1";
              uVar4 = 0x166;
            }
          }
          else {
            pcVar3 = "strcmp(\"0\", buffer) == 0";
            uVar4 = 0x164;
          }
        }
        else {
          pcVar3 = "zt_cstr_itoa(buffer, 0, 0, 100) == 1";
          uVar4 = 0x163;
        }
      }
      else {
        pcVar3 = "zt_cstr_itoa(buffer, 10, 5, 6) == -1";
        uVar4 = 0x160;
      }
    }
    else {
      pcVar3 = "zt_cstr_itoa(buffer, 0, 0, 0) == -1";
      uVar4 = 0x15f;
    }
  }
  else {
    pcVar3 = "zt_cstr_itoa(NULL, 0, 0, 100) == -1";
    uVar4 = 0x15e;
  }
  iVar1 = zt_unit_printf(&test->error,"%s : %s:%d",pcVar3,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                         ,uVar4);
  if (iVar1 == 0) {
    test->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)test->env,1);
}

Assistant:

static void itoa_test(struct zt_unit_test *test, void *data UNUSED) {
  int i;
  char buffer[100];

  memset(buffer, 0, 100);

  /* Illegal input validation. */
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(NULL, 0, 0, 100) == -1);
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 0, 0, 0) == -1);
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 10, 5, 6) == -1);

  /* Valid inputs */
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 0, 0, 100) == 1);
  ZT_UNIT_ASSERT(test, strcmp("0", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 3, 0, 100) == 1);
  ZT_UNIT_ASSERT(test, strcmp("3", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 10, 0, 100) == 2);
  ZT_UNIT_ASSERT(test, strcmp("10", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 42, 0, 100) == 2);
  ZT_UNIT_ASSERT(test, strcmp("42", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 987654321, 0, 100) == 9);
  ZT_UNIT_ASSERT(test, strcmp("987654321", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -3, 0, 100) == 2);
  ZT_UNIT_ASSERT(test, strcmp("-3", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -10, 0, 100) == 3);
  ZT_UNIT_ASSERT(test, strcmp("-10", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -42, 0, 100) == 3);
  ZT_UNIT_ASSERT(test, strcmp("-42", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -987654321, 0, 100) == 10);
  ZT_UNIT_ASSERT(test, strcmp("-987654321", buffer) == 0);

  /* offset */
  for (i = 0; i < 20; i++) {
    buffer[i] = 'a';
  }

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 301, 3, 100) == 6);
  ZT_UNIT_ASSERT(test, strcmp("aaa301", buffer) == 0);

  for (i = 0; i < 20; i++) {
    buffer[i] = 'a';
  }

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -5920, 4, 100) == 9);
  ZT_UNIT_ASSERT(test, strcmp("aaaa-5920", buffer) == 0);
}